

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::RobustnessRobustBufferAccessBehavior::GetnUniformTest::verifyResult
          (GetnUniformTest *this,void *inputData,void *resultData,int size,char *method)

{
  TestLog *this_00;
  MessageBuilder *pMVar1;
  bool bVar2;
  MessageBuilder local_1c0;
  int local_3c;
  char *pcStack_38;
  int diff;
  char *method_local;
  void *pvStack_28;
  int size_local;
  void *resultData_local;
  void *inputData_local;
  GetnUniformTest *this_local;
  
  pcStack_38 = method;
  method_local._4_4_ = size;
  pvStack_28 = resultData;
  resultData_local = inputData;
  inputData_local = this;
  local_3c = memcmp(inputData,resultData,(long)size);
  bVar2 = local_3c == 0;
  if (!bVar2) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [14])"Test failed! ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&stack0xffffffffffffffc8);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [28])" result is not as expected.");
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
  }
  return bVar2;
}

Assistant:

bool GetnUniformTest::verifyResult(const void* inputData, const void* resultData, int size, const char* method)
{
	int diff = memcmp(inputData, resultData, size);
	if (diff != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test failed! " << method << " result is not as expected."
						   << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}